

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::type_caster<long,_void>::load
          (type_caster<long,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  handle src_00;
  handle src_or_index;
  object local_30;
  object tmp;
  
  if ((((src.m_ptr != (PyObject *)0x0) && ((src.m_ptr)->ob_type != (PyTypeObject *)&PyFloat_Type))
      && (iVar2 = PyType_IsSubtype((src.m_ptr)->ob_type,&PyFloat_Type), iVar2 == 0)) &&
     (((convert || (((src.m_ptr)->ob_type->tp_flags & 0x1000000) != 0)) ||
      (iVar2 = PyIndex_Check(src.m_ptr), iVar2 != 0)))) {
    lVar3 = PyLong_AsLong(src.m_ptr);
    if ((lVar3 != -1) || (lVar4 = PyErr_Occurred(), lVar4 == 0)) {
      this->value = lVar3;
      return true;
    }
    PyErr_Clear();
    if ((convert) && (iVar2 = PyNumber_Check(src.m_ptr), iVar2 != 0)) {
      src_00.m_ptr = (PyObject *)PyNumber_Long(src.m_ptr);
      local_30.super_handle.m_ptr = (handle)(handle)src_00.m_ptr;
      PyErr_Clear();
      bVar1 = load(this,src_00,false);
      object::~object(&local_30);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool load(handle src, bool convert) {
        py_type py_value;

        if (!src)
            return false;

#if !defined(PYPY_VERSION)
        auto index_check = [](PyObject *o) { return PyIndex_Check(o); };
#else
        // In PyPy 7.3.3, `PyIndex_Check` is implemented by calling `__index__`,
        // while CPython only considers the existence of `nb_index`/`__index__`.
        auto index_check = [](PyObject *o) { return hasattr(o, "__index__"); };
#endif

        if (std::is_floating_point<T>::value) {
            if (convert || PyFloat_Check(src.ptr()))
                py_value = (py_type) PyFloat_AsDouble(src.ptr());
            else
                return false;
        } else if (PyFloat_Check(src.ptr())
                   || (!convert && !PYBIND11_LONG_CHECK(src.ptr()) && !index_check(src.ptr()))) {
            return false;
        } else {
            handle src_or_index = src;
#if PY_VERSION_HEX < 0x03080000
            object index;
            if (!PYBIND11_LONG_CHECK(src.ptr())) {  // So: index_check(src.ptr())
                index = reinterpret_steal<object>(PyNumber_Index(src.ptr()));
                if (!index) {
                    PyErr_Clear();
                    if (!convert)
                        return false;
                }
                else {
                    src_or_index = index;
                }
            }
#endif
            if (std::is_unsigned<py_type>::value) {
                py_value = as_unsigned<py_type>(src_or_index.ptr());
            } else { // signed integer:
                py_value = sizeof(T) <= sizeof(long)
                    ? (py_type) PyLong_AsLong(src_or_index.ptr())
                    : (py_type) PYBIND11_LONG_AS_LONGLONG(src_or_index.ptr());
            }
        }

        // Python API reported an error
        bool py_err = py_value == (py_type) -1 && PyErr_Occurred();

        // Check to see if the conversion is valid (integers should match exactly)
        // Signed/unsigned checks happen elsewhere
        if (py_err || (std::is_integral<T>::value && sizeof(py_type) != sizeof(T) && py_value != (py_type) (T) py_value)) {
            PyErr_Clear();
            if (py_err && convert && (PyNumber_Check(src.ptr()) != 0)) {
                auto tmp = reinterpret_steal<object>(std::is_floating_point<T>::value
                                                     ? PyNumber_Float(src.ptr())
                                                     : PyNumber_Long(src.ptr()));
                PyErr_Clear();
                return load(tmp, false);
            }
            return false;
        }

        value = (T) py_value;
        return true;
    }